

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateBuilderMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  RepeatedImmutableEnumFieldLiteGenerator *this_local;
  
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n  return instance.get$capitalized_name$List();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return instance.get$capitalized_name$Count();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public $type$ get$capitalized_name$(int index) {\n  return instance.get$capitalized_name$(index);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public Builder set$capitalized_name$(\n    int index, $type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(index, value);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public Builder add$capitalized_name$($type$ value) {\n  copyOnWrite();\n  instance.add$capitalized_name$(value);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public Builder addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$(values);  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(descriptor);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public java.util.List<java.lang.Integer>\nget$capitalized_name$ValueList() {\n  return java.util.Collections.unmodifiableList(\n      instance.get$capitalized_name$ValueList());\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public int get$capitalized_name$Value(int index) {\n  return instance.get$capitalized_name$Value(index);\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public Builder set$capitalized_name$Value(\n    int index, int value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Value(index, value);\n  return this;\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public Builder add$capitalized_name$Value(int value) {\n  instance.add$capitalized_name$Value(value);\n  return this;\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public Builder addAll$capitalized_name$Value(\n    java.lang.Iterable<java.lang.Integer> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$Value(values);\n  return this;\n}\n"
                      );
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n"
    "  return instance.get$capitalized_name$List();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return instance.get$capitalized_name$Count();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$(int index) {\n"
    "  return instance.get$capitalized_name$(index);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  copyOnWrite();\n"
    "  instance.set$capitalized_name$(index, value);\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$($type$ value) {\n"
    "  copyOnWrite();\n"
    "  instance.add$capitalized_name$(value);\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder addAll$capitalized_name$(\n"
    "    java.lang.Iterable<? extends $type$> values) {\n"
    "  copyOnWrite();\n"
    "  instance.addAll$capitalized_name$(values);"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  copyOnWrite();\n"
    "  instance.clear$capitalized_name$();\n"
    "  return this;\n"
    "}\n");

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public java.util.List<java.lang.Integer>\n"
      "get$capitalized_name$ValueList() {\n"
      "  return java.util.Collections.unmodifiableList(\n"
      "      instance.get$capitalized_name$ValueList());\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value(int index) {\n"
      "  return instance.get$capitalized_name$Value(index);\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public Builder set$capitalized_name$Value(\n"
      "    int index, int value) {\n"
      "  copyOnWrite();\n"
      "  instance.set$capitalized_name$Value(index, value);\n"
      "  return this;\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public Builder add$capitalized_name$Value(int value) {\n"
      "  instance.add$capitalized_name$Value(value);\n"
      "  return this;\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public Builder addAll$capitalized_name$Value(\n"
      "    java.lang.Iterable<java.lang.Integer> values) {\n"
      "  copyOnWrite();\n"
      "  instance.addAll$capitalized_name$Value(values);\n"
      "  return this;\n"
      "}\n");
  }
}